

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_posix.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Loadable_Module::DLSym<std::shared_ptr<chaiscript::Module>_(*)()>::DLSym
          (DLSym<std::shared_ptr<chaiscript::Module>_(*)()> *this,DLModule *t_mod,string *t_symbol)

{
  _func_shared_ptr<chaiscript::Module> *p_Var1;
  load_module_error *this_00;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  p_Var1 = (_func_shared_ptr<chaiscript::Module> *)dlsym(t_mod->m_data,(t_symbol->_M_dataplus)._M_p)
  ;
  this->m_symbol = p_Var1;
  if (p_Var1 != (_func_shared_ptr<chaiscript::Module> *)0x0) {
    return;
  }
  this_00 = (load_module_error *)__cxa_allocate_exception(0x10);
  __s = (char *)dlerror();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  chaiscript::exception::load_module_error::load_module_error(this_00,&local_38);
  __cxa_throw(this_00,&chaiscript::exception::load_module_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

DLSym(DLModule &t_mod, const std::string &t_symbol)
          : m_symbol(reinterpret_cast<T>(dlsym(t_mod.m_data, t_symbol.c_str()))) {
        if (!m_symbol) {
          throw chaiscript::exception::load_module_error(dlerror());
        }
      }